

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStateDirectory.cxx
# Opt level: O1

bool __thiscall
cmStateDirectory::ContainsBoth(cmStateDirectory *this,string *param_1,string *remote_path)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  PointerType pBVar4;
  
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  bVar1 = cmsys::SystemTools::ComparePath(param_1,&pBVar4->RelativePathTopBinary);
  if (bVar1) {
LAB_001a39c3:
    pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                       (&this->DirectoryState);
    bVar2 = cmsys::SystemTools::ComparePath(remote_path,&pBVar4->RelativePathTopBinary);
    bVar1 = true;
    if (!bVar2) {
      bVar1 = cmsys::SystemTools::IsSubDirectory(remote_path,&pBVar4->RelativePathTopBinary);
    }
  }
  else {
    bVar1 = cmsys::SystemTools::IsSubDirectory(param_1,&pBVar4->RelativePathTopBinary);
    if (bVar1) goto LAB_001a39c3;
    bVar1 = false;
  }
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  bVar2 = cmsys::SystemTools::ComparePath(param_1,&pBVar4->RelativePathTopSource);
  if (!bVar2) {
    bVar2 = cmsys::SystemTools::IsSubDirectory(param_1,&pBVar4->RelativePathTopSource);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_001a3a53;
    }
  }
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&this->DirectoryState);
  bVar3 = cmsys::SystemTools::ComparePath(remote_path,&pBVar4->RelativePathTopSource);
  bVar2 = true;
  if (!bVar3) {
    bVar2 = cmsys::SystemTools::IsSubDirectory(remote_path,&pBVar4->RelativePathTopSource);
  }
LAB_001a3a53:
  return (bool)(bVar1 | bVar2);
}

Assistant:

bool cmStateDirectory::ContainsBoth(std::string const& local_path,
                                    std::string const& remote_path) const
{
  auto PathEqOrSubDir = [](std::string const& a, std::string const& b) {
    return (cmSystemTools::ComparePath(a, b) ||
            cmSystemTools::IsSubDirectory(a, b));
  };

  bool bothInBinary = PathEqOrSubDir(local_path, GetRelativePathTopBinary()) &&
    PathEqOrSubDir(remote_path, GetRelativePathTopBinary());

  bool bothInSource = PathEqOrSubDir(local_path, GetRelativePathTopSource()) &&
    PathEqOrSubDir(remote_path, GetRelativePathTopSource());

  return bothInBinary || bothInSource;
}